

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

void cf_ssl_scache_sesssion_ldestroy(void *udata,void *obj)

{
  (*Curl_cfree)(*obj);
  (*Curl_cfree)(*(void **)((long)obj + 0x30));
  (*Curl_cfree)(*(void **)((long)obj + 0x20));
  (*Curl_cfree)(obj);
  return;
}

Assistant:

static void cf_ssl_scache_sesssion_ldestroy(void *udata, void *obj)
{
  struct Curl_ssl_session *s = obj;
  (void)udata;
  free(CURL_UNCONST(s->sdata));
  free(CURL_UNCONST(s->quic_tp));
  free((void *)s->alpn);
  free(s);
}